

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O1

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptInit
          (OSSLEVPSymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *IV,bool padding,
          size_t counterBits,ByteString *aad,size_t tagBytes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *pEVar5;
  undefined4 extraout_var_02;
  uchar *puVar6;
  uchar *puVar7;
  undefined4 extraout_var_03;
  ulong uVar8;
  char *pcVar9;
  undefined4 extraout_var_04;
  int outLen;
  ByteString dummy_1;
  ByteString iv;
  undefined4 extraout_var_01;
  
  bVar1 = SymmetricAlgorithm::encryptInit
                    (&this->super_SymmetricAlgorithm,key,mode,IV,padding,counterBits,aad,tagBytes);
  if (!bVar1) {
    return false;
  }
  if ((mode != GCM) && (sVar4 = ByteString::size(IV), sVar4 != 0)) {
    sVar4 = ByteString::size(IV);
    iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    if (sVar4 != CONCAT44(extraout_var,iVar2)) {
      sVar4 = ByteString::size(IV);
      iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
      softHSMLog(3,"encryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x79,"Invalid IV size (%d bytes, expected %d bytes)",sVar4,
                 CONCAT44(extraout_var_04,iVar2));
      ByteString::ByteString(&iv);
      SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&iv);
      iv._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      return false;
    }
  }
  ByteString::ByteString(&iv);
  sVar4 = ByteString::size(IV);
  if (sVar4 == 0) {
    iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    ByteString::wipe(&iv,CONCAT44(extraout_var_00,iVar2));
  }
  else {
    ByteString::operator=(&iv,IV);
  }
  counterBitsInit(this,&iv,counterBits);
  iVar2 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0x15])(this);
  cipher = (EVP_CIPHER *)CONCAT44(extraout_var_01,iVar2);
  if (cipher == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"encryptInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x93,"Failed to initialise EVP encrypt operation");
    ByteString::ByteString(&dummy_1);
    SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
  }
  else {
    pEVar5 = EVP_CIPHER_CTX_new();
    this->pCurCTX = (EVP_CIPHER_CTX *)pEVar5;
    if (pEVar5 == (EVP_CIPHER_CTX *)0x0) {
      softHSMLog(3,"encryptInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0xa0,"Failed to allocate space for EVP_CIPHER_CTX");
      ByteString::ByteString(&dummy_1);
      SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
    }
    else {
      if (mode == GCM) {
        iVar2 = 0;
        iVar3 = EVP_EncryptInit_ex(pEVar5,cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
        if (iVar3 != 0) {
          pEVar5 = (EVP_CIPHER_CTX *)this->pCurCTX;
          sVar4 = ByteString::size(&iv);
          EVP_CIPHER_CTX_ctrl(pEVar5,9,(int)sVar4,(void *)0x0);
          pEVar5 = (EVP_CIPHER_CTX *)this->pCurCTX;
          iVar2 = (*(((this->super_SymmetricAlgorithm).currentKey)->super_Serialisable).
                    _vptr_Serialisable[4])();
          puVar6 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var_02,iVar2));
          puVar7 = ByteString::byte_str(&iv);
          iVar2 = EVP_EncryptInit_ex(pEVar5,(EVP_CIPHER *)0x0,(ENGINE *)0x0,puVar6,puVar7);
        }
      }
      else {
        iVar2 = (*(((this->super_SymmetricAlgorithm).currentKey)->super_Serialisable).
                  _vptr_Serialisable[4])();
        puVar6 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var_03,iVar2));
        puVar7 = ByteString::byte_str(&iv);
        iVar2 = EVP_EncryptInit(pEVar5,cipher,puVar6,puVar7);
      }
      if (iVar2 == 0) {
        uVar8 = ERR_get_error();
        pcVar9 = ERR_error_string(uVar8,(char *)0x0);
        softHSMLog(3,"encryptInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0xba,"Failed to initialise EVP encrypt operation: %s",pcVar9);
        clean(this);
        ByteString::ByteString(&dummy_1);
        SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
      }
      else {
        EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)this->pCurCTX,(uint)padding);
        bVar1 = true;
        if (mode != GCM) goto LAB_00122300;
        outLen = 0;
        sVar4 = ByteString::size(aad);
        if (sVar4 == 0) goto LAB_00122300;
        pEVar5 = (EVP_CIPHER_CTX *)this->pCurCTX;
        puVar6 = ByteString::const_byte_str(aad);
        sVar4 = ByteString::size(aad);
        iVar2 = EVP_EncryptUpdate(pEVar5,(uchar *)0x0,&outLen,puVar6,(int)sVar4);
        if (iVar2 != 0) goto LAB_00122300;
        uVar8 = ERR_get_error();
        pcVar9 = ERR_error_string(uVar8,(char *)0x0);
        softHSMLog(3,"encryptInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0xcb,"Failed to update with AAD: %s",pcVar9);
        clean(this);
        ByteString::ByteString(&dummy_1);
        SymmetricAlgorithm::encryptFinal(&this->super_SymmetricAlgorithm,&dummy_1);
      }
    }
  }
  dummy_1._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&dummy_1.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>)
  ;
  bVar1 = false;
LAB_00122300:
  iv._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& IV /* = ByteString()*/, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& aad /* = ByteString() */, size_t tagBytes /* = 0 */)
{
	// Call the superclass initialiser
	if (!SymmetricAlgorithm::encryptInit(key, mode, IV, padding, counterBits, aad, tagBytes))
	{
		return false;
	}

	// Check the IV
	if (mode != SymMode::GCM && (IV.size() > 0) && (IV.size() != getBlockSize()))
	{
		ERROR_MSG("Invalid IV size (%d bytes, expected %d bytes)", IV.size(), getBlockSize());

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	ByteString iv;

	if (IV.size() > 0)
	{
		iv = IV;
	}
	else
	{
		iv.wipe(getBlockSize());
	}

	counterBitsInit(iv, counterBits);

	// Determine the cipher class
	const EVP_CIPHER* cipher = getCipher();

	if (cipher == NULL)
	{
		ERROR_MSG("Failed to initialise EVP encrypt operation");

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	// Allocate the EVP context
	pCurCTX = EVP_CIPHER_CTX_new();

	if (pCurCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	int rv;
	if (mode == SymMode::GCM)
	{
		rv = EVP_EncryptInit_ex(pCurCTX, cipher, NULL, NULL, NULL);

		if (rv)
		{
			EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_IVLEN, iv.size(), NULL);
			rv = EVP_EncryptInit_ex(pCurCTX, NULL, NULL, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
		}
	}
	else
	{
		rv = EVP_EncryptInit(pCurCTX, cipher, (unsigned char*) currentKey->getKeyBits().const_byte_str(), iv.byte_str());
	}

	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP encrypt operation: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	EVP_CIPHER_CTX_set_padding(pCurCTX, padding ? 1 : 0);

	if (mode == SymMode::GCM)
	{
		int outLen = 0;
		if (aad.size() && !EVP_EncryptUpdate(pCurCTX, NULL, &outLen, (unsigned char*) aad.const_byte_str(), aad.size()))
		{
			ERROR_MSG("Failed to update with AAD: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			ByteString dummy;
			SymmetricAlgorithm::encryptFinal(dummy);

			return false;
		}
	}

	return true;
}